

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmenu.cpp
# Opt level: O0

QAction * __thiscall QMenuPrivate::actionAt(QMenuPrivate *this,QPoint p)

{
  byte bVar1;
  qsizetype qVar2;
  const_reference pQVar3;
  ulong uVar4;
  const_reference ppQVar5;
  long in_RDI;
  long in_FS_OFFSET;
  int i;
  qsizetype in_stack_ffffffffffffffa8;
  QList<QRect> *in_stack_ffffffffffffffb0;
  int local_34;
  QAction *local_28;
  QMenuPrivate *local_20;
  undefined1 local_10 [8];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  _local_20 = rect(local_20);
  bVar1 = QRect::contains((QPoint *)&local_20,SUB81(local_10,0));
  if (((bVar1 ^ 0xff) & 1) == 0) {
    local_34 = 0;
    while( true ) {
      qVar2 = QList<QRect>::size((QList<QRect> *)(in_RDI + 600));
      if (qVar2 <= local_34) break;
      pQVar3 = QList<QRect>::at(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
      uVar4 = QRect::contains((QPoint *)pQVar3,SUB81(local_10,0));
      if ((uVar4 & 1) != 0) {
        ppQVar5 = QList<QAction_*>::at
                            ((QList<QAction_*> *)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8
                            );
        local_28 = *ppQVar5;
        goto LAB_00642d36;
      }
      local_34 = local_34 + 1;
    }
    local_28 = (QAction *)0x0;
  }
  else {
    local_28 = (QAction *)0x0;
  }
LAB_00642d36:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_28;
  }
  __stack_chk_fail();
}

Assistant:

QAction *QMenuPrivate::actionAt(QPoint p) const
{
    if (!rect().contains(p))     //sanity check
       return nullptr;

    for(int i = 0; i < actionRects.size(); i++) {
        if (actionRects.at(i).contains(p))
            return actions.at(i);
    }
    return nullptr;
}